

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

U32 ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr,int optLevel)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  U32 UVar6;
  
  if (0x20000 < litLength) {
    __assert_fail("litLength <= ZSTD_BLOCKSIZE_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x125,"U32 ZSTD_litLengthPrice(const U32, const optState_t *const, int)");
  }
  if (optPtr->priceType != zop_predef) {
    iVar2 = 0;
    UVar6 = litLength;
    do {
      if (UVar6 != 0x20000) {
        if (UVar6 < 0x40) {
          uVar4 = (uint)(byte)ZSTD_LLcode_LL_Code[UVar6];
        }
        else {
          uVar4 = 0x1f;
          if (UVar6 != 0) {
            for (; UVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
            }
          }
          uVar4 = (uVar4 ^ 0xffffffe0) + 0x33;
        }
        uVar3 = optPtr->litLengthFreq[uVar4] + 1;
        if (optLevel == 0) {
          if (uVar3 == 0) goto LAB_00207306;
          uVar1 = 0x1f;
          if (uVar3 != 0) {
            for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
            }
          }
          iVar5 = (uVar1 ^ 0x1f) * 0x100 + -0x1f00;
        }
        else {
          if (uVar3 == 0) {
LAB_00207306:
            __assert_fail("val != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                          ,0xab,"unsigned int ZSTD_highbit32(U32)");
          }
          uVar1 = 0x1f;
          if (uVar3 != 0) {
            for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
            }
          }
          if (0x16 < uVar1) {
            __assert_fail("hb + BITCOST_ACCURACY < 31",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                          ,0x3c,"U32 ZSTD_fracWeight(U32)");
          }
          iVar5 = -((uVar3 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100);
        }
        iVar5 = (uint)""[uVar4] * 0x100 + optPtr->litLengthSumBasePrice + iVar5;
        goto LAB_002072e3;
      }
      iVar2 = iVar2 + 0x100;
      UVar6 = 0x1ffff;
    } while (optPtr->priceType != zop_predef);
  }
  uVar4 = litLength + 1;
  iVar5 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar5 == 0; iVar5 = iVar5 + -1) {
    }
  }
  if (optLevel == 0) {
    iVar5 = iVar5 << 8;
    iVar2 = 0;
  }
  else {
    iVar5 = (uVar4 * 0x100 >> ((byte)iVar5 & 0x1f)) + iVar5 * 0x100;
    iVar2 = 0;
  }
LAB_002072e3:
  return iVar2 + iVar5;
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr, int optLevel)
{
    assert(litLength <= ZSTD_BLOCKSIZE_MAX);
    if (optPtr->priceType == zop_predef)
        return WEIGHT(litLength, optLevel);

    /* ZSTD_LLcode() can't compute litLength price for sizes >= ZSTD_BLOCKSIZE_MAX
     * because it isn't representable in the zstd format.
     * So instead just pretend it would cost 1 bit more than ZSTD_BLOCKSIZE_MAX - 1.
     * In such a case, the block would be all literals.
     */
    if (litLength == ZSTD_BLOCKSIZE_MAX)
        return BITCOST_MULTIPLIER + ZSTD_litLengthPrice(ZSTD_BLOCKSIZE_MAX - 1, optPtr, optLevel);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] * BITCOST_MULTIPLIER)
             + optPtr->litLengthSumBasePrice
             - WEIGHT(optPtr->litLengthFreq[llCode], optLevel);
    }
}